

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O1

void __thiscall
libcellml::Validator::ValidatorImpl::validateAndCleanMathCiCnNodes
          (ValidatorImpl *this,XmlNodePtr *node,ComponentPtr *component,NameList *variableNames)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  XmlNode XVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  XmlNodePtr childNode;
  XmlNode local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  XmlNodePtr local_38;
  
  bVar3 = XmlNode::isMathmlElement
                    ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr,"cn");
  if (bVar3) {
    validateAndCleanCnNode(this,node,component);
  }
  else {
    bVar3 = XmlNode::isMathmlElement
                      ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr,"ci");
    if (bVar3) {
      validateAndCleanCiNode(this,node,component,variableNames);
    }
  }
  XmlNode::firstChild((XmlNode *)&local_38);
  if (local_38.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    validateAndCleanMathCiCnNodes(this,&local_38,component,variableNames);
  }
  XmlNode::next(&local_48);
  p_Var2 = p_Stack_40;
  XVar1.mPimpl = local_48.mPimpl;
  local_48.mPimpl = (XmlNodeImpl *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
            _M_pi;
  (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)XVar1.mPimpl;
  (node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  if ((node->super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    validateAndCleanMathCiCnNodes(this,node,component,variableNames);
  }
  if (local_38.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void Validator::ValidatorImpl::validateAndCleanMathCiCnNodes(XmlNodePtr &node, const ComponentPtr &component, const NameList &variableNames)
{
    if (node->isMathmlElement("cn")) {
        validateAndCleanCnNode(node, component);
    } else if (node->isMathmlElement("ci")) {
        validateAndCleanCiNode(node, component, variableNames);
    }
    // Check children for ci/cn.
    XmlNodePtr childNode = node->firstChild();
    if (childNode != nullptr) {
        validateAndCleanMathCiCnNodes(childNode, component, variableNames);
    }
    // Check siblings for ci/cn.
    node = node->next();
    if (node != nullptr) {
        validateAndCleanMathCiCnNodes(node, component, variableNames);
    }
}